

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

Value * system_function_input(Value *context_value,TupleValue *parameter_values)

{
  int iVar1;
  Value *pVVar2;
  char *val;
  int iVar3;
  size_t buffer_length;
  char buffer [100000];
  char acStack_186a8 [100000];
  
  if (parameter_values->length != 0) {
    pVVar2 = convert_to_string_value(*parameter_values->items);
    printf("%s",*(undefined8 *)(pVVar2 + 1));
    free_value(pVVar2);
  }
  buffer_length = 0;
  while( true ) {
    iVar1 = getchar_unlocked();
    iVar3 = iVar1 * 0x1000000;
    if ((iVar3 == -0x1000000) || (iVar3 == 0xa000000)) break;
    if (0x1fffffff < iVar3) {
      acStack_186a8[buffer_length] = (char)iVar1;
      buffer_length = buffer_length + 1;
    }
  }
  val = create_string_from_buffer(acStack_186a8,buffer_length);
  pVVar2 = new_string_value(val,buffer_length);
  return pVVar2;
}

Assistant:

Value *system_function_input(Value *context_value, TupleValue *parameter_values) {
  if (parameter_values->length > 0) {
    StringValue *string_value = (StringValue *) convert_to_string_value(parameter_values->items[0]);

    printf("%s", string_value->string_value);

    free_value((Value *) string_value);
  }

  char buffer[BUFFER_SIZE];
  size_t buffer_length = 0;

  char c;

  while (true) {
    c = getchar_unlocked();

    if (c == EOF || c == '\n') break;
    else if (c < ' ') continue;

    buffer[buffer_length++] = c;
  }

  return new_string_value(create_string_from_buffer(buffer, buffer_length), buffer_length);
}